

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O1

wchar_t history_total_bytes(void)

{
  int iVar1;
  size_t sVar2;
  wchar_t wVar3;
  long lVar4;
  HistEvent ev;
  HistEvent_conflict local_28;
  
  iVar1 = history(h,&local_28,8);
  wVar3 = L'\xffffffff';
  if (iVar1 == 0) {
    history(h,&local_28,3);
    lVar4 = 0;
    do {
      sVar2 = strlen(local_28.str);
      lVar4 = lVar4 + sVar2;
      wVar3 = (wchar_t)lVar4;
      iVar1 = history(h,&local_28,6);
    } while (iVar1 == 0);
    history(h,&local_28,0x10,(ulong)(uint)local_28.num);
  }
  return wVar3;
}

Assistant:

int
history_total_bytes(void)
{
	HistEvent ev;
	int curr_num;
	size_t size;

	if (history(h, &ev, H_CURR) != 0)
		return -1;
	curr_num = ev.num;

	(void)history(h, &ev, H_FIRST);
	size = 0;
	do
		size += strlen(ev.str) * sizeof(*ev.str);
	while (history(h, &ev, H_NEXT) == 0);

	/* get to the same position as before */
	history(h, &ev, H_PREV_EVENT, curr_num);

	return (int)size;
}